

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVStreambuf.h
# Opt level: O3

int __thiscall
cmBasicUVStreambuf<char,_std::char_traits<char>_>::open
          (cmBasicUVStreambuf<char,_std::char_traits<char>_> *this,char *__file,int __oflag,...)

{
  close(this,(int)__file);
  this->Stream = (uv_stream_t *)__file;
  this->EndOfFile = false;
  if (__file != (char *)0x0) {
    this->OldStreamData = *(void **)__file;
    *(cmBasicUVStreambuf<char,_std::char_traits<char>_> **)__file = this;
  }
  StreamReadStartStop(this);
  return (int)this;
}

Assistant:

cmBasicUVStreambuf<CharT, Traits>* cmBasicUVStreambuf<CharT, Traits>::open(
  uv_stream_t* stream)
{
  this->close();
  this->Stream = stream;
  this->EndOfFile = false;
  if (this->Stream) {
    this->OldStreamData = this->Stream->data;
    this->Stream->data = this;
  }
  this->StreamReadStartStop();
  return this;
}